

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_filesystem_primitive_isAbsolute
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  uVar1 = *arguments;
  if ((((uVar1 & 0xf) == 0 && uVar1 != 0) && ((*(uint *)(uVar1 + 8) & 0x300) == 0x200)) &&
     (*(int *)(uVar1 + 0xc) != 0)) {
    sVar2 = (sysbvm_tuple_t)(*(char *)(uVar1 + 0x10) == '/');
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_filesystem_primitive_isAbsolute(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    return sysbvm_filesystem_isAbsolute(arguments[0]);
}